

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void cpu_get_tb_cpu_state_arm
               (CPUARMState *env,target_ulong *pc,target_ulong *cs_base,uint32_t *pflags)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  uVar3 = env->hflags;
  *(undefined4 *)cs_base = 0;
  if ((int)uVar3 < 0) {
    *(int *)pc = (int)env->pc;
    lVar5 = 0x148;
    if ((env[1].xregs[0x13] & 0xf) != 0) {
      uVar3 = uVar3 & 0xfffff3ff | (env->btype & 3) << 10;
    }
  }
  else {
    *(uint32_t *)pc = env->regs[0xf];
    uVar2 = env->features;
    if (((uint)uVar2 >> 9 & 1) == 0) {
      if ((uVar2 & 2) == 0) {
        uVar3 = ((env->vfp).vec_stride & 3U) << 0xc |
                ((env->vfp).vec_len & 7U) << 9 | uVar3 & 0x7fffc1ff;
      }
      else {
        uVar3 = ((env->cp15).c15_cpar & 3) << 0xc | uVar3 & 0x7fffcfff;
      }
      uVar3 = (env->vfp).xregs[8] >> 0x10 & 0x4000 | uVar3;
    }
    else {
      if ((uVar2 >> 0x25 & 1) == 0) {
        uVar4 = (env->v7m).secure;
      }
      else {
        uVar4 = (env->v7m).secure;
        if (((env->v7m).fpccr[1] >> 2 & 1) != uVar4) {
          uVar3 = uVar3 | 0x2000;
        }
      }
      if (((int)(env->v7m).fpccr[uVar4] < 0) &&
         ((uVar1 = (env->v7m).control[1], (uVar1 & 4) == 0 ||
          ((char)((uVar1 & 8) >> 3) == '\0' && uVar4 != 0)))) {
        uVar3 = uVar3 | 0x1000;
      }
      uVar3 = (*(uint *)((long)(env->v7m).fpccr + (ulong)((env->v7m).fpccr[1] & 4)) & 1) << 0xb |
              uVar3;
    }
    uVar3 = (uint)(byte)env->condexec_bits | (env->thumb & 1) << 8 | uVar3 & 0xfffffe00;
    lVar5 = 0x154;
  }
  uVar4 = uVar3 | 0x20000000;
  if ((*(uint *)((long)env->regs + lVar5) >> 0x15 & 1) == 0) {
    uVar4 = uVar3;
  }
  if ((uVar3 >> 0x1e & 1) == 0) {
    uVar4 = uVar3;
  }
  *pflags = uVar4;
  return;
}

Assistant:

void cpu_get_tb_cpu_state(CPUARMState *env, target_ulong *pc,
                          target_ulong *cs_base, uint32_t *pflags)
{
    uint32_t flags = env->hflags;
    uint32_t pstate_for_ss;

    *cs_base = 0;
    assert_hflags_rebuild_correctly(env);

    if (FIELD_EX32(flags, TBFLAG_ANY, AARCH64_STATE)) {
        *pc = env->pc;
        if (cpu_isar_feature(aa64_bti, env_archcpu(env))) {
            FIELD_DP32(flags, TBFLAG_A64, BTYPE, env->btype, flags);
        }
        pstate_for_ss = env->pstate;
    } else {
        *pc = env->regs[15];

        if (arm_feature(env, ARM_FEATURE_M)) {
            if (arm_feature(env, ARM_FEATURE_M_SECURITY) &&
                FIELD_EX32(env->v7m.fpccr[M_REG_S], V7M_FPCCR, S)
                != env->v7m.secure) {
                FIELD_DP32(flags, TBFLAG_M32, FPCCR_S_WRONG, 1, flags);
            }

            if ((env->v7m.fpccr[env->v7m.secure] & R_V7M_FPCCR_ASPEN_MASK) &&
                (!(env->v7m.control[M_REG_S] & R_V7M_CONTROL_FPCA_MASK) ||
                 (env->v7m.secure &&
                  !(env->v7m.control[M_REG_S] & R_V7M_CONTROL_SFPA_MASK)))) {
                /*
                 * ASPEN is set, but FPCA/SFPA indicate that there is no
                 * active FP context; we must create a new FP context before
                 * executing any FP insn.
                 */
                FIELD_DP32(flags, TBFLAG_M32, NEW_FP_CTXT_NEEDED, 1, flags);
            }

            bool is_secure = env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_S_MASK;
            if (env->v7m.fpccr[is_secure] & R_V7M_FPCCR_LSPACT_MASK) {
                FIELD_DP32(flags, TBFLAG_M32, LSPACT, 1, flags);
            }
        } else {
            /*
             * Note that XSCALE_CPAR shares bits with VECSTRIDE.
             * Note that VECLEN+VECSTRIDE are RES0 for M-profile.
             */
            if (arm_feature(env, ARM_FEATURE_XSCALE)) {
                FIELD_DP32(flags, TBFLAG_A32,
                                   XSCALE_CPAR, env->cp15.c15_cpar, flags);
            } else {
                FIELD_DP32(flags, TBFLAG_A32, VECLEN,
                                   env->vfp.vec_len, flags);
                FIELD_DP32(flags, TBFLAG_A32, VECSTRIDE,
                                   env->vfp.vec_stride, flags);
            }
            if (env->vfp.xregs[ARM_VFP_FPEXC] & (1 << 30)) {
                FIELD_DP32(flags, TBFLAG_A32, VFPEN, 1, flags);
            }
        }

        FIELD_DP32(flags, TBFLAG_AM32, THUMB, env->thumb, flags);
        FIELD_DP32(flags, TBFLAG_AM32, CONDEXEC, env->condexec_bits, flags);
        pstate_for_ss = env->uncached_cpsr;
    }

    /*
     * The SS_ACTIVE and PSTATE_SS bits correspond to the state machine
     * states defined in the ARM ARM for software singlestep:
     *  SS_ACTIVE   PSTATE.SS   State
     *     0            x       Inactive (the TB flag for SS is always 0)
     *     1            0       Active-pending
     *     1            1       Active-not-pending
     * SS_ACTIVE is set in hflags; PSTATE_SS is computed every TB.
     */
    if (FIELD_EX32(flags, TBFLAG_ANY, SS_ACTIVE) &&
        (pstate_for_ss & PSTATE_SS)) {
        FIELD_DP32(flags, TBFLAG_ANY, PSTATE_SS, 1, flags);
    }

    *pflags = flags;
}